

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O1

MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)

{
  BitReadCtx_t *bitctx;
  RK_U8 RVar1;
  MPP_RET MVar2;
  uint uVar3;
  int iVar4;
  char *fmt;
  RK_U32 (*paRVar5) [64];
  RK_U32 *unaff_RBP;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  RK_S32 _out;
  RK_U32 local_4c;
  int local_48;
  uint local_44;
  long local_40;
  RK_U32 (*local_38) [64];
  
  bitctx = &p_dec->bitctx;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_picture_header_comm");
  }
  MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_4c);
  (p_dec->bitctx).ret = MVar2;
  if (MVar2 == MPP_OK) {
    (p_dec->ph).enable_loop_filter = (byte)local_4c ^ 1;
    if ((byte)local_4c == 1) {
LAB_00185a55:
      MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_4c);
      (p_dec->bitctx).ret = MVar2;
      if (MVar2 == MPP_OK) {
        (p_dec->ph).enable_chroma_quant_param = (byte)local_4c ^ 1;
        if ((byte)local_4c == 1) {
          (p_dec->ph).chroma_quant_param_delta_cb = '\0';
          (p_dec->ph).chroma_quant_param_delta_cr = '\0';
LAB_00185a91:
          if (((byte)((p_dec->ph).chroma_quant_param_delta_cb - 0x11U) < 0xdf) ||
             ((byte)((p_dec->ph).chroma_quant_param_delta_cr - 0x11U) < 0xdf)) {
            fmt = "invalid chrome quant param delta.\n";
LAB_00185abb:
            _mpp_log_l(2,"avs2d_ps",fmt,"parse_picture_header_comm");
            unaff_RBP = (RK_U32 *)0xffffffff;
LAB_00185ad3:
            if (((byte)avs2d_parse_debug & 8) != 0) {
              _mpp_log_l(4,"avs2d_ps","Out, Failed","parse_picture_header_comm");
            }
            goto LAB_00185a2d;
          }
          p_dec->enable_wq = '\0';
          if ((p_dec->vsh).enable_weighted_quant == '\0') goto LAB_00185dda;
          MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_4c);
          (p_dec->bitctx).ret = MVar2;
          iVar4 = 6;
          if (MVar2 == MPP_OK) {
            (p_dec->ph).enable_pic_weight_quant = (RK_U8)local_4c;
            iVar4 = 0;
          }
          if (iVar4 == 6) goto LAB_001859ff;
          if (iVar4 != 0) goto LAB_00185a2d;
          if ((p_dec->ph).enable_pic_weight_quant == '\0') goto LAB_00185dda;
          p_dec->enable_wq = '\x01';
          MVar2 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_4c);
          (p_dec->bitctx).ret = MVar2;
          iVar4 = 6;
          if (MVar2 == MPP_OK) {
            (p_dec->ph).pic_wq_data_index = (RK_U8)local_4c;
            iVar4 = 0;
          }
          if (iVar4 != 6) {
            if (iVar4 != 0) goto LAB_00185a2d;
            RVar1 = (p_dec->ph).pic_wq_data_index;
            if (RVar1 != '\x01') {
              if (RVar1 == '\x02') {
                paRVar5 = (p_dec->ph).pic_wq_matrix;
                lVar7 = 0;
                do {
                  uVar8 = 4 << ((byte)lVar7 & 0x1f);
                  local_48 = (int)lVar7 + 2;
                  uVar3 = 0;
                  local_40 = lVar7;
                  local_38 = paRVar5;
                  do {
                    unaff_RBP = *local_38 + (uVar3 << ((byte)local_48 & 0x1f));
                    uVar6 = 0;
                    local_44 = uVar3;
                    do {
                      MVar2 = mpp_read_ue(bitctx,&local_4c);
                      (p_dec->bitctx).ret = MVar2;
                      iVar4 = 6;
                      if (MVar2 != MPP_OK) goto LAB_00185dc9;
                      unaff_RBP[uVar6] = local_4c;
                      uVar6 = uVar6 + 1;
                    } while (uVar8 != uVar6);
                    uVar3 = local_44 + 1;
                  } while (uVar3 != uVar8);
                  lVar7 = local_40 + 1;
                  paRVar5 = local_38 + 1;
                } while (local_40 == 0);
                iVar4 = 0;
LAB_00185dc9:
                if (iVar4 == 6) goto LAB_001859ff;
                if (iVar4 != 0) goto LAB_00185a2d;
              }
LAB_00185dda:
              if ((p_dec->vsh).enable_alf == '\0') {
                unaff_RBP = (RK_U32 *)0x0;
              }
              else {
                MVar2 = parse_pic_alf_params(bitctx,&p_dec->ph);
                unaff_RBP = (RK_U32 *)(ulong)(uint)MVar2;
                if (MVar2 < MPP_OK) {
                  if (((byte)avs2d_parse_debug & 4) != 0) {
                    _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x23c);
                  }
                  goto LAB_00185ad3;
                }
              }
              if (((byte)avs2d_parse_debug & 8) != 0) {
                _mpp_log_l(4,"avs2d_ps","Out, ret %d\n","parse_picture_header_comm",unaff_RBP);
              }
              goto LAB_00185a2d;
            }
            MVar2 = mpp_skip_longbits(bitctx,1);
            (p_dec->bitctx).ret = MVar2;
            if (MVar2 == MPP_OK) {
              MVar2 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_4c);
              (p_dec->bitctx).ret = MVar2;
              iVar4 = 6;
              if (MVar2 == MPP_OK) {
                (p_dec->ph).wq_param_index = (RK_U8)local_4c;
                iVar4 = 0;
              }
              if (iVar4 != 6) {
                if (iVar4 != 0) goto LAB_00185a2d;
                MVar2 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_4c);
                (p_dec->bitctx).ret = MVar2;
                iVar4 = 6;
                if (MVar2 == MPP_OK) {
                  (p_dec->ph).wq_model = (RK_U8)local_4c;
                  iVar4 = 0;
                }
                if (iVar4 != 6) {
                  if (iVar4 != 0) goto LAB_00185a2d;
                  RVar1 = (p_dec->ph).wq_param_index;
                  if (RVar1 == '\x01') {
                    lVar7 = 0;
                    do {
                      MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_4c);
                      (p_dec->bitctx).ret = MVar2;
                      iVar4 = 6;
                      if (MVar2 == MPP_OK) {
                        (p_dec->ph).wq_param_delta1[lVar7] = local_4c;
                        iVar4 = 0;
                      }
                      if (iVar4 != 0) goto joined_r0x00185c5c;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 6);
                  }
                  else if (RVar1 == '\x02') {
                    lVar7 = 0;
                    do {
                      MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_4c);
                      (p_dec->bitctx).ret = MVar2;
                      iVar4 = 6;
                      if (MVar2 == MPP_OK) {
                        (p_dec->ph).wq_param_delta2[lVar7] = local_4c;
                        iVar4 = 0;
                      }
                      if (iVar4 != 0) goto joined_r0x00185c5c;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 6);
                  }
                  goto LAB_00185dda;
                }
              }
            }
          }
        }
        else {
          MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_4c);
          (p_dec->bitctx).ret = MVar2;
          iVar4 = 6;
          if (MVar2 == MPP_OK) {
            (p_dec->ph).chroma_quant_param_delta_cb = (RK_U8)local_4c;
            iVar4 = 0;
          }
          if (iVar4 != 6) {
            if (iVar4 != 0) goto LAB_00185a2d;
            MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_4c);
            (p_dec->bitctx).ret = MVar2;
            iVar4 = 6;
            if (MVar2 == MPP_OK) {
              (p_dec->ph).chroma_quant_param_delta_cr = (RK_U8)local_4c;
              iVar4 = 0;
            }
            if (iVar4 == 0) goto LAB_00185a91;
joined_r0x00185c5c:
            if (iVar4 != 6) goto LAB_00185a2d;
          }
        }
      }
    }
    else {
      MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_4c);
      (p_dec->bitctx).ret = MVar2;
      iVar4 = 6;
      if (MVar2 == MPP_OK) {
        (p_dec->ph).loop_filter_parameter_flag = (RK_U8)local_4c;
        iVar4 = 0;
      }
      if (iVar4 != 6) {
        if (iVar4 != 0) goto LAB_00185a2d;
        if ((p_dec->ph).loop_filter_parameter_flag == '\0') {
          (p_dec->ph).alpha_c_offset = '\0';
          (p_dec->ph).beta_offset = '\0';
          goto LAB_00185a55;
        }
        MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_4c);
        (p_dec->bitctx).ret = MVar2;
        iVar4 = 6;
        if (MVar2 == MPP_OK) {
          (p_dec->ph).alpha_c_offset = (RK_U8)local_4c;
          iVar4 = 0;
        }
        if (iVar4 != 6) {
          if (iVar4 != 0) goto LAB_00185a2d;
          MVar2 = mpp_read_se(bitctx,(RK_S32 *)&local_4c);
          (p_dec->bitctx).ret = MVar2;
          iVar4 = 6;
          if (MVar2 == MPP_OK) {
            (p_dec->ph).beta_offset = (RK_U8)local_4c;
            iVar4 = 0;
          }
          if (iVar4 != 6) {
            if (iVar4 != 0) goto LAB_00185a2d;
            if ((0xee < (byte)((p_dec->ph).alpha_c_offset - 9U)) &&
               (0xee < (byte)((p_dec->ph).beta_offset - 9U))) goto LAB_00185a55;
            fmt = "invalid alpha_c_offset/beta_offset.\n";
            goto LAB_00185abb;
          }
        }
      }
    }
  }
LAB_001859ff:
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Out, Bit read Err","parse_picture_header_comm");
  }
  unaff_RBP = (RK_U32 *)(ulong)(uint)(p_dec->bitctx).ret;
LAB_00185a2d:
  return (MPP_RET)unaff_RBP;
}

Assistant:

static MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, j;
    RK_U32 val_temp = 0;

    BitReadCtx_t *bitctx  = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;
    Avs2dPicHeader_t *ph  = &p_dec->ph;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_loop_filter = val_temp ^ 0x01;
    if (ph->enable_loop_filter) {
        READ_ONEBIT(bitctx, &ph->loop_filter_parameter_flag);
        if (ph->loop_filter_parameter_flag) {
            READ_SE(bitctx, &ph->alpha_c_offset);
            READ_SE(bitctx, &ph->beta_offset);
            if (ph->alpha_c_offset < -8 || ph->alpha_c_offset > 8 ||
                ph->beta_offset < -8 || ph->beta_offset > 8) {
                ret = MPP_NOK;
                mpp_err_f("invalid alpha_c_offset/beta_offset.\n");
                goto __FAILED;
            }
        } else {
            ph->alpha_c_offset = 0;
            ph->beta_offset    = 0;
        }
    }

    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_chroma_quant_param = val_temp ^ 0x01;
    if (ph->enable_chroma_quant_param) {
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cb);
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cr);
    } else {
        ph->chroma_quant_param_delta_cb = 0;
        ph->chroma_quant_param_delta_cr = 0;
    }
    if (ph->chroma_quant_param_delta_cb < -16 || ph->chroma_quant_param_delta_cb > 16 ||
        ph->chroma_quant_param_delta_cr < -16 || ph->chroma_quant_param_delta_cr > 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid chrome quant param delta.\n");
        goto __FAILED;
    }

    p_dec->enable_wq = 0;
    if (vsh->enable_weighted_quant) {
        READ_ONEBIT(bitctx, &ph->enable_pic_weight_quant);
        if (ph->enable_pic_weight_quant) {
            p_dec->enable_wq = 1;
            READ_BITS(bitctx, 2, &ph->pic_wq_data_index);
            if (ph->pic_wq_data_index == 1) {
                SKIP_BITS(bitctx, 1);
                READ_BITS(bitctx, 2, &ph->wq_param_index);
                READ_BITS(bitctx, 2, &ph->wq_model);
                if (ph->wq_param_index == 1) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta1[i]);
                    }
                } else if (ph->wq_param_index == 2) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta2[i]);
                    }
                }
            } else if (ph->pic_wq_data_index == 2) {
                RK_U32 size_id, wqm_size;
                for (size_id = 0; size_id < 2; size_id++) {
                    wqm_size = MPP_MIN(1 << (size_id + 2), 8);
                    for (j = 0; j < wqm_size; j++) {
                        for (i = 0; i < wqm_size; i++) {
                            READ_UE(bitctx, &ph->pic_wq_matrix[size_id][j * wqm_size + i]);
                        }
                    }
                }
            }

        }
    }

    if (vsh->enable_alf) {
        FUN_CHECK(ret = parse_pic_alf_params(bitctx, ph));
    }

    AVS2D_PARSE_TRACE("Out, ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out, Bit read Err");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out, Failed");
    return ret;
}